

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_history.cpp
# Opt level: O3

UndoState * __thiscall
undo::UndoHistory::findCommonParent(UndoHistory *this,UndoState *a,UndoState *b)

{
  UndoState *pUVar1;
  UndoState *pUVar2;
  UndoState *pA;
  
  if (b != (UndoState *)0x0 && a != (UndoState *)0x0) {
    pUVar1 = a;
    if (a == b) {
      return a;
    }
    while ((pUVar2 = pUVar1->m_parent, pUVar1->m_parent != (UndoState *)0x0 ||
           (b = b->m_parent, pUVar2 = a, b != (UndoState *)0x0))) {
      pUVar1 = pUVar2;
      if (pUVar2 == b) {
        return pUVar2;
      }
    }
  }
  return (UndoState *)0x0;
}

Assistant:

const UndoState* UndoHistory::findCommonParent(const UndoState* a,
                                               const UndoState* b)
{
  const UndoState* pA = a;
  const UndoState* pB = b;

  if (pA == nullptr || pB == nullptr)
    return nullptr;

  while (pA != pB) {
    pA = pA->m_parent;
    if (!pA) {
      pA = a;
      pB = pB->m_parent;
      if (!pB)
        return nullptr;
    }
  }

  return pA;
}